

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp__findresult sVar1;
  bool local_39;
  stbrp_coord local_38;
  stbrp_coord sStack_34;
  stbrp__findresult fr;
  int local_20;
  int all_rects_packed;
  int i;
  int num_rects_local;
  stbrp_rect *rects_local;
  stbrp_context *context_local;
  
  fr.prev_link._4_4_ = 1;
  for (local_20 = 0; local_20 < num_rects; local_20 = local_20 + 1) {
    rects[local_20].was_packed = local_20;
  }
  ImQsort(rects,(long)num_rects,0x18,rect_height_compare);
  for (local_20 = 0; local_20 < num_rects; local_20 = local_20 + 1) {
    if ((rects[local_20].w == 0) || (rects[local_20].h == 0)) {
      rects[local_20].y = 0;
      rects[local_20].x = 0;
    }
    else {
      sVar1 = stbrp__skyline_pack_rectangle(context,rects[local_20].w,rects[local_20].h);
      fr._0_8_ = sVar1.prev_link;
      if (fr._0_8_ == 0) {
        rects[local_20].y = 0x7fffffff;
        rects[local_20].x = 0x7fffffff;
      }
      else {
        local_38 = sVar1.x;
        rects[local_20].x = local_38;
        sStack_34 = sVar1.y;
        rects[local_20].y = sStack_34;
      }
    }
  }
  ImQsort(rects,(long)num_rects,0x18,rect_original_order);
  for (local_20 = 0; local_20 < num_rects; local_20 = local_20 + 1) {
    local_39 = false;
    if (rects[local_20].x == 0x7fffffff) {
      local_39 = rects[local_20].y == 0x7fffffff;
    }
    rects[local_20].was_packed = (uint)((local_39 ^ 0xffU) & 1);
    if (rects[local_20].was_packed == 0) {
      fr.prev_link._4_4_ = 0;
    }
  }
  return fr.prev_link._4_4_;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}